

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::UnitTest::PopGTestTrace(UnitTest *this)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  MutexLock lock;
  GTestMutexLock local_10;
  
  local_10.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_10.mutex_);
  this_00 = internal::
            ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
            ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::pop_back
            (this_00);
  internal::GTestMutexLock::~GTestMutexLock(&local_10);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().pop_back();
}